

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnTableFillExpr
          (BinaryReaderInterp *this,Index table_index)

{
  Result RVar1;
  Location loc_1;
  Location loc;
  Var local_78;
  
  loc.field_1.field_0.last_column = 0;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset = loc_1.field_1.field_1.offset;
  Var::Var(&local_78,table_index,&loc_1);
  RVar1 = SharedValidator::OnTableFill(&this->validator_,&loc,&local_78);
  Var::~Var(&local_78);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,TableFill,table_index);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnTableFillExpr(Index table_index) {
  CHECK_RESULT(
      validator_.OnTableFill(GetLocation(), Var(table_index, GetLocation())));
  istream_.Emit(Opcode::TableFill, table_index);
  return Result::Ok;
}